

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptional.cxx
# Opt level: O0

void __thiscall EventLogger::~EventLogger(EventLogger *this)

{
  value_type local_30;
  EventLogger *local_10;
  EventLogger *this_local;
  
  local_30.Type = DESTRUCT;
  local_30.Logger2 = (EventLogger *)0x0;
  local_30.Value = this->Value;
  local_30.Logger1 = this;
  local_10 = this;
  std::vector<Event,_std::allocator<Event>_>::push_back(&events,&local_30);
  return;
}

Assistant:

EventLogger::~EventLogger()
{
  BEGIN_IGNORE_UNINITIALIZED
  events.push_back({ Event::DESTRUCT, this, nullptr, this->Value });
  END_IGNORE_UNINITIALIZED
}